

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O3

bool chibi_filesystem::write_if_different(char *text,char *filename)

{
  int iVar1;
  FILE *pFVar2;
  __ssize_t _Var3;
  char *line;
  size_t line_size;
  string existing_text;
  char *local_60;
  size_t local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  pFVar2 = fopen(filename,"rt");
  if (pFVar2 != (FILE *)0x0) {
    local_48 = 0;
    local_40[0] = 0;
    local_60 = (char *)0x0;
    local_58 = 0;
    local_50 = local_40;
    while (_Var3 = getline(&local_60,&local_58,pFVar2), -1 < _Var3) {
      std::__cxx11::string::append((char *)&local_50);
    }
    free(local_60);
    local_60 = (char *)0x0;
    iVar1 = std::__cxx11::string::compare((char *)&local_50);
    fclose(pFVar2);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (iVar1 == 0) {
      return true;
    }
  }
  pFVar2 = fopen(filename,"wt");
  if (pFVar2 != (FILE *)0x0) {
    fputs(text,pFVar2);
    fclose(pFVar2);
    return true;
  }
  return false;
}

Assistant:

bool write_if_different(const char * text, const char * filename)
	{
		FileHandle existing_file(filename, "rt");
		
		bool is_equal = false;
		
		if (existing_file != nullptr)
		{
			std::string existing_text;
			
			char * line = nullptr;
			size_t line_size = 0;
			
			for (;;)
			{
				const ssize_t r = getline(&line, &line_size, existing_file);
				
				if (r < 0)
					break;
				
				existing_text.append(line);
			}
			
			free(line);
			line = nullptr;
			
			if (text == existing_text)
				is_equal = true;
			
			existing_file.close();
		}
		
		if (is_equal)
		{
			return true;
		}
		else
		{
			FileHandle file(filename, "wt");
			
			if (file == nullptr)
			{
				return false;
			}
			else
			{
				fprintf(file, "%s", text);
				
				file.close();
				
				return true;
			}
		}
	}